

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  FILE *file;
  int len;
  char **argv_local;
  int argc_local;
  
  printf("*** LIBTRIE UNIT TESTS AND DEMO ***\n\n\n");
  if (argc < 2) {
    builtin_memcpy(dic_path,"../dic/english.txt",0x12);
  }
  else {
    for (file._4_4_ = 0; argv[1][file._4_4_] != '\0'; file._4_4_ = file._4_4_ + 1) {
    }
    memcpy(dic_path,argv[1],(long)file._4_4_);
  }
  printf("dic_path %s\n",dic_path);
  __stream = fopen((char *)dic_path,"r");
  if (__stream == (FILE *)0x0) {
    printf("Unable to read dic: %s\n",dic_path);
    argv_local._4_4_ = 1;
  }
  else {
    fclose(__stream);
    iVar1 = all_tests();
    if (iVar1 == 0) {
      printf("Very good results! Tests passed: %d/%d\n",(ulong)(uint)tests_passed,
             (ulong)(uint)tests_passed);
    }
    else {
      printf("Results. Tests failed/passed: %d/%d\n",(ulong)(uint)tests_failed,
             (ulong)(uint)tests_passed);
    }
    argv_local._4_4_ = (uint)(tests_failed != 0);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    printf("*** LIBTRIE UNIT TESTS AND DEMO ***\n\n\n");
    //set dic_path if given
    if(argc > 1) {
        int len = 0;
        while (argv[1][len]){
            ++len;
        };
        memcpy(&dic_path, argv[1], len);
    } else{
        memcpy(&dic_path, "../dic/english.txt", 18);
    }

    printf("dic_path %s\n", dic_path);
    FILE *file = fopen(dic_path, "r");
    if (!file) {
        printf("Unable to read dic: %s\n", dic_path);
        return 1;
    }else{
        fclose(file);
    }

    all_tests() ? printf("Results. Tests failed/passed: %d/%d\n", tests_failed, tests_passed)
                : printf("Very good results! Tests passed: %d/%d\n", tests_passed, tests_passed);

    return tests_failed ? 1 : 0;
}